

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QLine>::emplace<QLine>(QPodArrayOps<QLine> *this,qsizetype i,QLine *args)

{
  QLine **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QPoint QVar4;
  QPoint QVar5;
  qsizetype qVar6;
  QLine *pQVar7;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QLine>).d;
  if ((pDVar3 != (Data *)0x0) &&
     ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (((this->super_QArrayDataPointer<QLine>).size == i) &&
       (qVar6 = QArrayDataPointer<QLine>::freeSpaceAtEnd(&this->super_QArrayDataPointer<QLine>),
       qVar6 != 0)) {
      QVar4 = args->pt2;
      pQVar7 = (this->super_QArrayDataPointer<QLine>).ptr +
               (this->super_QArrayDataPointer<QLine>).size;
      pQVar7->pt1 = args->pt1;
      pQVar7->pt2 = QVar4;
    }
    else {
      if ((i != 0) ||
         (qVar6 = QArrayDataPointer<QLine>::freeSpaceAtBegin(&this->super_QArrayDataPointer<QLine>),
         qVar6 == 0)) goto LAB_0039a41c;
      pQVar7 = (this->super_QArrayDataPointer<QLine>).ptr;
      QVar4 = args->pt2;
      pQVar7[-1].pt1 = args->pt1;
      pQVar7[-1].pt2 = QVar4;
      ppQVar1 = &(this->super_QArrayDataPointer<QLine>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QLine>).size;
    *pqVar2 = *pqVar2 + 1;
    return;
  }
LAB_0039a41c:
  QVar4 = args->pt1;
  QVar5 = args->pt2;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QLine>).size != 0);
  QArrayDataPointer<QLine>::detachAndGrow
            (&this->super_QArrayDataPointer<QLine>,where,1,(QLine **)0x0,
             (QArrayDataPointer<QLine> *)0x0);
  pQVar7 = createHole(this,where,i,1);
  pQVar7->pt1 = QVar4;
  pQVar7->pt2 = QVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }